

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeCopMemInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  DecodeStatus DVar4;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  ulong Val;
  uint uVar5;
  
  uVar1 = MCInst_getOpcode(Inst);
  Decoder_00 = (void *)(ulong)(uVar1 - 0x8a);
  if (((((uVar1 - 0x8a < 8) || (Decoder_00 = (void *)(ulong)(uVar1 - 0x18d), uVar1 - 0x18d < 8)) ||
       (Decoder_00 = (void *)(ulong)(uVar1 - 0xa1e), uVar1 - 0xa1e < 8)) || (uVar1 - 0x93d < 8)) &&
     ((Insn & 0xe00) == 0xa00)) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 8 & 0xf));
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 0xc & 0xf));
  DVar2 = DecodeGPRRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_00,Decoder_00);
  if ((DVar2 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  Val = (ulong)Insn & 0xff;
  uVar5 = Insn >> 0x17 & 1;
  uVar3 = MCInst_getOpcode(Inst);
  uVar1 = uVar3 - 0x82;
  if (uVar1 < 0x10) {
    if ((0x9999U >> (uVar1 & 0x1f) & 1) != 0) {
LAB_001beeb7:
      Val = (ulong)((uVar5 << 8 | (uint)Val) ^ 0x100);
      goto LAB_001beedb;
    }
    if ((0x4444U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001bee4d;
  }
  else {
LAB_001bee4d:
    uVar1 = uVar3 - 0x185;
    if (uVar1 < 0x10) {
      if ((0x9999U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001beeb7;
      if ((0x4444U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001beed4;
    }
    uVar1 = uVar3 - 0x935;
    if (uVar1 < 0x10) {
      if ((0x9999U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001beeb7;
      if ((0x4444U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001beed4;
    }
    uVar3 = uVar3 - 0xa16;
    if (0xf < uVar3) goto LAB_001beedb;
    if ((0x9999U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_001beeb7;
    if ((0x4444U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001beedb;
  }
LAB_001beed4:
  Val = (ulong)((uint)Val | uVar5 << 8);
LAB_001beedb:
  MCOperand_CreateImm0(Inst,Val);
  uVar1 = MCInst_getOpcode(Inst);
  if (((uVar1 - 0x18d < 8) || (uVar1 - 0x8a < 8)) &&
     ((DVar4 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,(void *)(ulong)(uVar1 - 0x18d)),
      DVar4 != MCDisassembler_Success &&
      (DVar2 = MCDisassembler_Fail, DVar4 == MCDisassembler_SoftFail)))) {
    DVar2 = MCDisassembler_SoftFail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeCopMemInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned CRd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned coproc = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDC_POST:
		case ARM_t2LDC_OPTION:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDCL_PRE:
		case ARM_t2LDCL_POST:
		case ARM_t2LDCL_OPTION:
		case ARM_t2STC_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STC_POST:
		case ARM_t2STC_OPTION:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STCL_PRE:
		case ARM_t2STCL_POST:
		case ARM_t2STCL_OPTION:
			if (coproc == 0xA || coproc == 0xB)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	MCOperand_CreateImm0(Inst, coproc);
	MCOperand_CreateImm0(Inst, CRd);
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDC2_OFFSET:
		case ARM_t2LDC2L_OFFSET:
		case ARM_t2LDC2_PRE:
		case ARM_t2LDC2L_PRE:
		case ARM_t2STC2_OFFSET:
		case ARM_t2STC2L_OFFSET:
		case ARM_t2STC2_PRE:
		case ARM_t2STC2L_PRE:
		case ARM_LDC2_OFFSET:
		case ARM_LDC2L_OFFSET:
		case ARM_LDC2_PRE:
		case ARM_LDC2L_PRE:
		case ARM_STC2_OFFSET:
		case ARM_STC2L_OFFSET:
		case ARM_STC2_PRE:
		case ARM_STC2L_PRE:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDCL_PRE:
		case ARM_t2STC_OFFSET:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STCL_PRE:
		case ARM_LDC_OFFSET:
		case ARM_LDCL_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDCL_PRE:
		case ARM_STC_OFFSET:
		case ARM_STCL_OFFSET:
		case ARM_STC_PRE:
		case ARM_STCL_PRE:
			imm = ARM_AM_getAM5Opc(U ? ARM_AM_add : ARM_AM_sub, (unsigned char)imm);
			MCOperand_CreateImm0(Inst, imm);
			break;
		case ARM_t2LDC2_POST:
		case ARM_t2LDC2L_POST:
		case ARM_t2STC2_POST:
		case ARM_t2STC2L_POST:
		case ARM_LDC2_POST:
		case ARM_LDC2L_POST:
		case ARM_STC2_POST:
		case ARM_STC2L_POST:
		case ARM_t2LDC_POST:
		case ARM_t2LDCL_POST:
		case ARM_t2STC_POST:
		case ARM_t2STCL_POST:
		case ARM_LDC_POST:
		case ARM_LDCL_POST:
		case ARM_STC_POST:
		case ARM_STCL_POST:
			imm |= U << 8;
			// fall through.
		default:
			// The 'option' variant doesn't encode 'U' in the immediate since
			// the immediate is unsigned [0,255].
			MCOperand_CreateImm0(Inst, imm);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
			if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}